

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UBool u_isgraph_63(UChar32 c)

{
  uint uVar1;
  int iVar2;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint32_t props;
  UChar32 c_local;
  
  uVar1 = c >> 5;
  if ((uint)c < 0xd800) {
    local_1c = (uint)propsTrie_index[(int)uVar1] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar2 = 0;
      if (c < 0xdc00) {
        iVar2 = 0x140;
      }
      local_20 = (uint)propsTrie_index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0x110000) {
          local_28 = (uint)propsTrie_index
                           [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar1 & 0x3f))] * 4 +
                     (c & 0x1fU);
        }
        else {
          local_28 = 0x53c8;
        }
        local_24 = local_28;
      }
      else {
        local_24 = 0x11f4;
      }
      local_20 = local_24;
    }
    local_1c = local_20;
  }
  return (1 << ((byte)propsTrie_index[local_1c] & 0x1f) & 0x5f001U) == 0;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isgraph(UChar32 c) {
    uint32_t props;
    GET_PROPS(c, props);
    /* comparing ==0 returns FALSE for the categories mentioned */
    return (UBool)((CAT_MASK(props)&
                    (U_GC_CC_MASK|U_GC_CF_MASK|U_GC_CS_MASK|U_GC_CN_MASK|U_GC_Z_MASK))
                   ==0);
}